

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool safe_strequal(char *str1,char *str2)

{
  int iVar1;
  
  if (str2 != (char *)0x0 && str1 != (char *)0x0) {
    iVar1 = Curl_raw_equal(str1,str2);
    return iVar1 != 0;
  }
  return str1 == (char *)0x0 && str2 == (char *)0x0;
}

Assistant:

static bool safe_strequal(char* str1, char* str2)
{
  if(str1 && str2)
    /* both pointers point to something then compare them */
    return (0 != Curl_raw_equal(str1, str2)) ? TRUE : FALSE;
  else
    /* if both pointers are NULL then treat them as equal */
    return (!str1 && !str2) ? TRUE : FALSE;
}